

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

QPDFEFStreamObjectHelper *
QPDFEFStreamObjectHelper::newFromStream
          (QPDFEFStreamObjectHelper *__return_storage_ptr__,QPDFObjectHandle *stream)

{
  bool bVar1;
  qpdf_offset_t value;
  string local_240;
  string local_220;
  QPDFObjectHandle local_200;
  allocator<char> local_1e9;
  string local_1e8;
  QPDFObjectHandle local_1c8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  undefined1 local_168 [8];
  Pl_Count count;
  Pl_MD5 md5;
  Pl_Discard discard;
  string local_a8;
  QPDFObjectHandle local_88;
  allocator<char> local_71;
  string local_70;
  QPDFObjectHandle local_50 [2];
  QPDFObjectHandle local_30;
  byte local_19;
  QPDFObjectHandle *local_18;
  QPDFObjectHandle *stream_local;
  QPDFEFStreamObjectHelper *result;
  
  local_19 = 0;
  local_18 = stream;
  stream_local = (QPDFObjectHandle *)__return_storage_ptr__;
  QPDFObjectHandle::QPDFObjectHandle(&local_30,stream);
  QPDFEFStreamObjectHelper(__return_storage_ptr__,&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  QPDFObjectHandle::getDict(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/Type",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"/EmbeddedFile",
             (allocator<char> *)((long)&discard.super_Pipeline.next_ + 7));
  QPDFObjectHandle::newName(&local_88,&local_a8);
  QPDFObjectHandle::replaceKey(local_50,&local_70,&local_88);
  QPDFObjectHandle::~QPDFObjectHandle(&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&discard.super_Pipeline.next_ + 7));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  QPDFObjectHandle::~QPDFObjectHandle(local_50);
  Pl_Discard::Pl_Discard((Pl_Discard *)&md5.enabled);
  Pl_MD5::Pl_MD5((Pl_MD5 *)&count.m,"EF md5",(Pipeline *)&md5.enabled);
  Pl_Count::Pl_Count((Pl_Count *)local_168,"EF size",(Pipeline *)&count.m);
  bVar1 = QPDFObjectHandle::pipeStreamData
                    (stream,(Pipeline *)local_168,(bool *)0x0,0,qpdf_dl_all,false,false);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"/Size",&local_1b1);
    value = Pl_Count::getCount((Pl_Count *)local_168);
    QPDFObjectHandle::newInteger(&local_1c8,value);
    setParam(__return_storage_ptr__,&local_1b0,&local_1c8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"/CheckSum",&local_1e9);
    Pl_MD5::getHexDigest_abi_cxx11_(&local_240,(Pl_MD5 *)&count.m);
    QUtil::hex_decode(&local_220,&local_240);
    QPDFObjectHandle::newString(&local_200,&local_220);
    setParam(__return_storage_ptr__,&local_1e8,&local_200);
    QPDFObjectHandle::~QPDFObjectHandle(&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"unable to get stream data for new embedded file stream",
               &local_189);
    QPDFObjectHandle::warnIfPossible(stream,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
  }
  local_19 = 1;
  Pl_Count::~Pl_Count((Pl_Count *)local_168);
  Pl_MD5::~Pl_MD5((Pl_MD5 *)&count.m);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&md5.enabled);
  if ((local_19 & 1) == 0) {
    ~QPDFEFStreamObjectHelper(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFEFStreamObjectHelper
QPDFEFStreamObjectHelper::newFromStream(QPDFObjectHandle stream)
{
    QPDFEFStreamObjectHelper result(stream);
    stream.getDict().replaceKey("/Type", QPDFObjectHandle::newName("/EmbeddedFile"));
    Pl_Discard discard;
    // The PDF spec specifies use of MD5 here and notes that it is not to be used for security. MD5
    // is known to be insecure.
    Pl_MD5 md5("EF md5", &discard);
    Pl_Count count("EF size", &md5);
    if (!stream.pipeStreamData(&count, nullptr, 0, qpdf_dl_all)) {
        stream.warnIfPossible("unable to get stream data for new embedded file stream");
    } else {
        result.setParam("/Size", QPDFObjectHandle::newInteger(count.getCount()));
        result.setParam(
            "/CheckSum", QPDFObjectHandle::newString(QUtil::hex_decode(md5.getHexDigest())));
    }
    return result;
}